

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipcommunication.c
# Opt level: O1

int ipcmd_recv_msq(ipcmd_t *ipcmd,YPSpur_msg *data)

{
  int iVar1;
  ssize_t sVar2;
  
  iVar1 = -1;
  if ((ipcmd != (ipcmd_t *)0x0) && (iVar1 = -1, ipcmd->connection_error == 0)) {
    sVar2 = msgrcv(ipcmd->socket,data,0x30,(long)ipcmd->pid,0);
    iVar1 = (int)sVar2;
    if (iVar1 < 0) {
      ipcmd->connection_error = 1;
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int ipcmd_recv_msq(struct ipcmd_t* ipcmd, YPSpur_msg* data)
{
  int received;
  size_t len = YPSPUR_MSG_SIZE;

  if (ipcmd == NULL || ipcmd->connection_error)
    return -1;

  received = msgrcv(ipcmd->socket, data, len, ipcmd->pid, 0);
  if (received < 0)
  {
    ipcmd->connection_error = 1;
    return -1;
  }
  return received;
}